

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O1

helper * __thiscall adios2::helper::CommWithMPI(helper *this,MPI_Comm mpiComm)

{
  int iVar1;
  long *plVar2;
  pointer *__ptr;
  
  if ((CommWithMPI(ompi_communicator_t*)::initMPI == '\0') &&
     (iVar1 = __cxa_guard_acquire(&CommWithMPI(ompi_communicator_t*)::initMPI), iVar1 != 0)) {
    core::RegisterMPIEngines();
    __cxa_guard_release(&CommWithMPI(ompi_communicator_t*)::initMPI);
  }
  if (mpiComm == (MPI_Comm)&ompi_mpi_comm_null) {
    adios2::helper::CommDummy();
  }
  else {
    plVar2 = (long *)operator_new(0x10);
    *plVar2 = (long)&PTR__CommImplMPI_001656c8;
    plVar2[1] = (long)mpiComm;
    adios2::helper::CommImpl::MakeComm(this);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  return this;
}

Assistant:

Comm CommWithMPI(MPI_Comm mpiComm)
{
    static InitMPI const initMPI;
    if (mpiComm == MPI_COMM_NULL)
    {
        return CommDummy();
    }
    auto comm = std::unique_ptr<CommImpl>(new CommImplMPI(mpiComm));
    return CommImpl::MakeComm(std::move(comm));
}